

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_stream.c
# Opt level: O2

_Bool al_set_audio_stream_playmode(ALLEGRO_AUDIO_STREAM *stream,ALLEGRO_PLAYMODE val)

{
  ALLEGRO_PLAYMODE AVar1;
  
  if (val == ALLEGRO_PLAYMODE_ONCE) {
    AVar1 = _ALLEGRO_PLAYMODE_STREAM_ONCE;
  }
  else if ((val != ALLEGRO_PLAYMODE_LOOP) ||
          (AVar1 = _ALLEGRO_PLAYMODE_STREAM_ONEDIR, stream->feeder == (stream_callback_t)0x0)) {
    return false;
  }
  (stream->spl).loop = AVar1;
  return true;
}

Assistant:

bool al_set_audio_stream_playmode(ALLEGRO_AUDIO_STREAM *stream,
   ALLEGRO_PLAYMODE val)
{
   ASSERT(stream);

   if (val == ALLEGRO_PLAYMODE_ONCE) {
      stream->spl.loop = _ALLEGRO_PLAYMODE_STREAM_ONCE;
      return true;
   }
   else if (val == ALLEGRO_PLAYMODE_LOOP) {
      /* Only streams creating by al_load_audio_stream() support
       * looping. */
      if (!stream->feeder)
         return false;

      stream->spl.loop = _ALLEGRO_PLAYMODE_STREAM_ONEDIR;
      return true;
   }

   // XXX _al_set_error
   return false;
}